

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests_impl.h
# Opt level: O1

void test_schnorrsig_bip_vectors_check_signing
               (uchar *sk,uchar *pk_serialized,uchar *aux_rand,uchar *msg,size_t msglen,
               uchar *expected_sig)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  uchar *keypair_00;
  size_t msglen_00;
  secp256k1_keypair *keypair_01;
  secp256k1_context *input32;
  int iVar4;
  size_t sVar5;
  secp256k1_keypair *psVar6;
  secp256k1_xonly_pubkey *pubkey;
  secp256k1_schnorrsig_extraparams extraparams;
  uchar sig [64];
  secp256k1_xonly_pubkey pk;
  secp256k1_keypair keypair;
  secp256k1_xonly_pubkey pk_expected;
  secp256k1_xonly_pubkey sStackY_1d8;
  size_t sStackY_198;
  uchar *puStackY_190;
  uchar *puStackY_188;
  code *pcStackY_180;
  secp256k1_schnorrsig_extraparams local_168;
  undefined1 local_148 [64];
  undefined1 local_108 [160];
  byte local_68 [64];
  
  local_168.magic[0] = 0xda;
  local_168.magic[1] = 'o';
  local_168.magic[2] = 0xb3;
  local_168.magic[3] = 0x8c;
  local_168._4_4_ = 0;
  local_168.noncefp = (secp256k1_nonce_function_hardened)0x0;
  keypair_01 = (secp256k1_keypair *)(local_108 + 0x40);
  pcStackY_180 = (code *)0x169b45;
  keypair_00 = msg;
  input32 = CTX;
  sVar5 = msglen;
  local_168.ndata = aux_rand;
  iVar3 = secp256k1_keypair_create(CTX,keypair_01,sk);
  iVar4 = (int)sVar5;
  if (iVar3 == 0) {
    pcStackY_180 = (code *)0x169cbf;
    test_schnorrsig_bip_vectors_check_signing_cold_9();
LAB_00169cbf:
    pcStackY_180 = (code *)0x169cc4;
    test_schnorrsig_bip_vectors_check_signing_cold_8();
LAB_00169cc4:
    pcStackY_180 = (code *)0x169cc9;
    test_schnorrsig_bip_vectors_check_signing_cold_1();
LAB_00169cc9:
    pcStackY_180 = (code *)0x169cce;
    test_schnorrsig_bip_vectors_check_signing_cold_6();
LAB_00169cce:
    pcStackY_180 = (code *)0x169cd3;
    test_schnorrsig_bip_vectors_check_signing_cold_5();
LAB_00169cd3:
    pcStackY_180 = (code *)0x169cd8;
    test_schnorrsig_bip_vectors_check_signing_cold_3();
LAB_00169cd8:
    pcStackY_180 = (code *)0x169cdd;
    test_schnorrsig_bip_vectors_check_signing_cold_4();
  }
  else {
    keypair_01 = (secp256k1_keypair *)local_148;
    psVar6 = (secp256k1_keypair *)(local_108 + 0x40);
    pcStackY_180 = (code *)0x169b71;
    keypair_00 = (uchar *)msglen;
    input32 = CTX;
    iVar3 = secp256k1_schnorrsig_sign_custom(CTX,(uchar *)keypair_01,msg,msglen,psVar6,&local_168);
    iVar4 = (int)psVar6;
    if (iVar3 == 0) goto LAB_00169cbf;
    keypair_00 = (uchar *)0x0;
    do {
      bVar1 = local_148[(long)keypair_00];
      keypair_01 = (secp256k1_keypair *)(ulong)bVar1;
      bVar2 = expected_sig[(long)keypair_00];
      input32 = (secp256k1_context *)(ulong)bVar2;
      iVar3 = (uint)bVar1 - (uint)bVar2;
      if (bVar1 != bVar2) goto LAB_00169b9e;
      keypair_00 = keypair_00 + 1;
    } while (keypair_00 != (uchar *)0x40);
    iVar3 = 0;
LAB_00169b9e:
    if (iVar3 != 0) goto LAB_00169cc4;
    if (msglen != 0x20) {
LAB_00169c1f:
      keypair_01 = (secp256k1_keypair *)local_68;
      pcStackY_180 = (code *)0x169c36;
      input32 = CTX;
      iVar3 = secp256k1_xonly_pubkey_parse(CTX,(secp256k1_xonly_pubkey *)keypair_01,pk_serialized);
      if (iVar3 == 0) goto LAB_00169cc9;
      keypair_01 = (secp256k1_keypair *)local_108;
      keypair_00 = local_108 + 0x40;
      pcStackY_180 = (code *)0x169c59;
      input32 = CTX;
      iVar3 = secp256k1_keypair_xonly_pub
                        (CTX,(secp256k1_xonly_pubkey *)keypair_01,(int *)0x0,
                         (secp256k1_keypair *)keypair_00);
      if (iVar3 == 0) goto LAB_00169cce;
      keypair_00 = (uchar *)0x0;
      do {
        bVar1 = local_108[(long)keypair_00];
        keypair_01 = (secp256k1_keypair *)(ulong)bVar1;
        bVar2 = local_68[(long)keypair_00];
        input32 = (secp256k1_context *)(ulong)bVar2;
        iVar3 = (uint)bVar1 - (uint)bVar2;
        if (bVar1 != bVar2) goto LAB_00169c85;
        keypair_00 = keypair_00 + 1;
      } while (keypair_00 != (uchar *)0x40);
      iVar3 = 0;
LAB_00169c85:
      if (iVar3 != 0) goto LAB_00169cd3;
      keypair_01 = (secp256k1_keypair *)local_148;
      pubkey = (secp256k1_xonly_pubkey *)local_108;
      pcStackY_180 = (code *)0x169ca5;
      keypair_00 = (uchar *)msglen;
      input32 = CTX;
      iVar3 = secp256k1_schnorrsig_verify(CTX,(uchar *)keypair_01,msg,msglen,pubkey);
      iVar4 = (int)pubkey;
      if (iVar3 != 0) {
        return;
      }
      goto LAB_00169cd8;
    }
    keypair_01 = (secp256k1_keypair *)local_148;
    local_148[0x30] = '\0';
    local_148[0x31] = '\0';
    local_148[0x32] = '\0';
    local_148[0x33] = '\0';
    local_148[0x34] = '\0';
    local_148[0x35] = '\0';
    local_148[0x36] = '\0';
    local_148[0x37] = '\0';
    local_148[0x38] = '\0';
    local_148[0x39] = '\0';
    local_148[0x3a] = '\0';
    local_148[0x3b] = '\0';
    local_148[0x3c] = '\0';
    local_148[0x3d] = '\0';
    local_148[0x3e] = '\0';
    local_148[0x3f] = '\0';
    local_148[0x20] = '\0';
    local_148[0x21] = '\0';
    local_148[0x22] = '\0';
    local_148[0x23] = '\0';
    local_148[0x24] = '\0';
    local_148[0x25] = '\0';
    local_148[0x26] = '\0';
    local_148[0x27] = '\0';
    local_148[0x28] = '\0';
    local_148[0x29] = '\0';
    local_148[0x2a] = '\0';
    local_148[0x2b] = '\0';
    local_148[0x2c] = '\0';
    local_148[0x2d] = '\0';
    local_148[0x2e] = '\0';
    local_148[0x2f] = '\0';
    local_148[0x10] = '\0';
    local_148[0x11] = '\0';
    local_148[0x12] = '\0';
    local_148[0x13] = '\0';
    local_148[0x14] = '\0';
    local_148[0x15] = '\0';
    local_148[0x16] = '\0';
    local_148[0x17] = '\0';
    local_148[0x18] = '\0';
    local_148[0x19] = '\0';
    local_148[0x1a] = '\0';
    local_148[0x1b] = '\0';
    local_148[0x1c] = '\0';
    local_148[0x1d] = '\0';
    local_148[0x1e] = '\0';
    local_148[0x1f] = '\0';
    local_148[0] = '\0';
    local_148[1] = '\0';
    local_148[2] = '\0';
    local_148[3] = '\0';
    local_148[4] = '\0';
    local_148[5] = '\0';
    local_148[6] = '\0';
    local_148[7] = '\0';
    local_148[8] = '\0';
    local_148[9] = '\0';
    local_148[10] = '\0';
    local_148[0xb] = '\0';
    local_148[0xc] = '\0';
    local_148[0xd] = '\0';
    local_148[0xe] = '\0';
    local_148[0xf] = '\0';
    psVar6 = (secp256k1_keypair *)(local_108 + 0x40);
    keypair_00 = (uchar *)0x20;
    pcStackY_180 = (code *)0x169bea;
    input32 = CTX;
    iVar3 = secp256k1_schnorrsig_sign_internal
                      (CTX,(uchar *)keypair_01,msg,0x20,psVar6,nonce_function_bip340,aux_rand);
    iVar4 = (int)psVar6;
    if (iVar3 != 0) {
      keypair_00 = (uchar *)0x0;
      do {
        bVar1 = local_148[(long)keypair_00];
        keypair_01 = (secp256k1_keypair *)(ulong)bVar1;
        bVar2 = expected_sig[(long)keypair_00];
        input32 = (secp256k1_context *)(ulong)bVar2;
        iVar3 = (uint)bVar1 - (uint)bVar2;
        if (bVar1 != bVar2) goto LAB_00169c17;
        keypair_00 = keypair_00 + 1;
      } while (keypair_00 != (uchar *)0x40);
      iVar3 = 0;
LAB_00169c17:
      if (iVar3 != 0) goto LAB_00169ce2;
      goto LAB_00169c1f;
    }
  }
  pcStackY_180 = (code *)0x169ce2;
  test_schnorrsig_bip_vectors_check_signing_cold_7();
LAB_00169ce2:
  pcStackY_180 = test_schnorrsig_bip_vectors_check_verify;
  test_schnorrsig_bip_vectors_check_signing_cold_2();
  sStackY_198 = msglen;
  puStackY_190 = expected_sig;
  puStackY_188 = msg;
  pcStackY_180 = (code *)pk_serialized;
  iVar3 = secp256k1_xonly_pubkey_parse(CTX,&sStackY_1d8,(uchar *)input32);
  if (iVar3 == 0) {
    test_schnorrsig_bip_vectors_check_verify_cold_2();
  }
  else {
    iVar3 = secp256k1_schnorrsig_verify(CTX,keypair_00,keypair_01->data,msglen_00,&sStackY_1d8);
    if (iVar3 == iVar4) {
      return;
    }
  }
  test_schnorrsig_bip_vectors_check_verify_cold_1();
  return;
}

Assistant:

static void test_schnorrsig_bip_vectors_check_signing(const unsigned char *sk, const unsigned char *pk_serialized, const unsigned char *aux_rand, const unsigned char *msg, size_t msglen, const unsigned char *expected_sig) {
    unsigned char sig[64];
    secp256k1_keypair keypair;
    secp256k1_xonly_pubkey pk, pk_expected;

    secp256k1_schnorrsig_extraparams extraparams = SECP256K1_SCHNORRSIG_EXTRAPARAMS_INIT;
    extraparams.ndata = (unsigned char*)aux_rand;

    CHECK(secp256k1_keypair_create(CTX, &keypair, sk));
    CHECK(secp256k1_schnorrsig_sign_custom(CTX, sig, msg, msglen, &keypair, &extraparams));
    CHECK(secp256k1_memcmp_var(sig, expected_sig, 64) == 0);
    if (msglen == 32) {
        memset(sig, 0, 64);
        CHECK(secp256k1_schnorrsig_sign32(CTX, sig, msg, &keypair, aux_rand));
        CHECK(secp256k1_memcmp_var(sig, expected_sig, 64) == 0);
    }

    CHECK(secp256k1_xonly_pubkey_parse(CTX, &pk_expected, pk_serialized));
    CHECK(secp256k1_keypair_xonly_pub(CTX, &pk, NULL, &keypair));
    CHECK(secp256k1_memcmp_var(&pk, &pk_expected, sizeof(pk)) == 0);
    CHECK(secp256k1_schnorrsig_verify(CTX, sig, msg, msglen, &pk));
}